

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSetAttrItem::DebugXmlRhs
          (GdlSetAttrItem *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  bool bVar1;
  ostream *poVar2;
  size_type_conflict sVar3;
  ulong uVar4;
  string *in_RCX;
  ostream *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  uint ipavs_1;
  uint ipavs;
  bool fNeedSlotAttrs;
  GrcSymbolTableEntry *in_stack_ffffffffffffff48;
  string local_78 [32];
  uint local_58;
  uint local_54;
  byte local_4d;
  string *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  GrcManager *in_stack_ffffffffffffffc8;
  GdlAttrValueSpec *in_stack_ffffffffffffffd0;
  GrcSymbolTableEntry *in_stack_ffffffffffffffd8;
  
  poVar2 = std::operator<<(in_RDX,"          <rhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::operator<<(poVar2,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  sVar3 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                    ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                     (in_RDI + 0xf));
  if (sVar3 != 0) {
    std::operator<<(in_RDX,"\" assignmentGdl=\"");
    (**(code **)(*in_RDI + 0x138))(in_RDI,in_RSI,0,0,in_RDX,1);
  }
  poVar2 = std::operator<<(in_RDX,"\" slotIndex=\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)in_RDI[6] + 1);
  std::operator<<(poVar2,"\"");
  local_4d = 0;
  local_54 = 0;
  do {
    uVar4 = (ulong)local_54;
    sVar3 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                      ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                       (in_RDI + 0xf));
    if (sVar3 <= uVar4) {
LAB_00125878:
      if ((local_4d & 1) == 0) {
        std::operator<<(in_RDX,"/>\n");
      }
      else {
        std::operator<<(in_RDX,">\n            <slotAttrs");
        local_58 = 0;
        while( true ) {
          uVar4 = (ulong)local_58;
          sVar3 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                            ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                             (in_RDI + 0xf));
          if (sVar3 <= uVar4) break;
          std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
                    ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                     (in_RDI + 0xf),(ulong)local_58);
          std::__cxx11::string::string(local_78,in_RCX);
          GdlAttrValueSpec::DebugXml
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
          std::__cxx11::string::~string(local_78);
          local_58 = local_58 + 1;
        }
        std::operator<<(in_RDX," />\n          </rhsSlot>\n");
      }
      return;
    }
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
              ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RDI + 0xf),
               (ulong)local_54);
    bVar1 = GrcSymbolTableEntry::IsAttachment(in_stack_ffffffffffffff48);
    if (bVar1) {
      local_4d = 1;
      goto LAB_00125878;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void GdlSetAttrItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "          <rhsSlot className=\"" << m_psymInput->FullAbbrev();
	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}

	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\"";

	bool fNeedSlotAttrs = false;
	for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
	{
		// For now, we only need attachment slot attributes.
		if (m_vpavs[ipavs]->m_psymName->IsAttachment())
		{
			fNeedSlotAttrs = true;
			break;
		}
	}
	if (fNeedSlotAttrs)
	{
		strmOut << ">\n            <slotAttrs";
		for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
		{
			m_vpavs[ipavs]->DebugXml(pcman, strmOut, staPathToCur);
		}
		strmOut << " />\n          </rhsSlot>\n";
	}
	else
	{
		strmOut << "/>\n";
	}
}